

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ptls_hash_context_t * sha256_create(void)

{
  ptls_hash_context_t *ppVar1;
  
  ppVar1 = (ptls_hash_context_t *)malloc(0x80);
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    ppVar1 = (ptls_hash_context_t *)0x0;
  }
  else {
    ppVar1->update = sha256_update;
    ppVar1->final = sha256_final;
    SHA256_Init((SHA256_CTX *)(ppVar1 + 1));
  }
  return ppVar1;
}

Assistant:

static ptls_hash_context_t *sha256_create(void)
{
    struct sha256_context_t *ctx;

    if ((ctx = malloc(sizeof(*ctx))) == NULL)
        return NULL;
    ctx->super = (ptls_hash_context_t){sha256_update, sha256_final};
    SHA256_Init(&ctx->ctx);
    return &ctx->super;
}